

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result_conflict __thiscall
testing::internal::FunctionMocker<unsigned_long_()>::PerformDefaultAction
          (FunctionMocker<unsigned_long_()> *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  OnCallSpec<unsigned_long_()> *this_00;
  Action<unsigned_long_()> *pAVar2;
  Result RVar3;
  Result_conflict RVar4;
  string message;
  long *local_30 [2];
  long local_20 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<unsigned_long_()> *)0x0) {
    pAVar2 = OnCallSpec<unsigned_long_()>::GetAction(this_00);
    RVar3 = Action<unsigned_long_()>::Perform(pAVar2);
    return RVar3;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_30);
  if (DefaultValue<unsigned_long>::producer_ == (long *)0x0) {
    RVar4 = 0;
  }
  else {
    RVar4 = (**(code **)(*DefaultValue<unsigned_long>::producer_ + 0x10))();
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return RVar4;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }